

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O0

ssize_t archive_write_zip_data(archive_write *a,void *buff,size_t s)

{
  int iVar1;
  undefined4 uVar2;
  char *in_RDX;
  void *in_RSI;
  archive *in_RDI;
  zip_conflict *zip;
  int ret;
  uint in_stack_ffffffffffffffc8;
  archive_write *a_00;
  char *local_20;
  char *local_8;
  
  a_00 = *(archive_write **)&in_RDI[1].current_codepage;
  local_20 = in_RDX;
  if ((long)(a_00->archive).compression_name < (long)in_RDX) {
    local_20 = (a_00->archive).compression_name;
  }
  *(char **)&(a_00->archive).compression_code =
       local_20 + *(long *)&(a_00->archive).compression_code;
  if (local_20 == (char *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    iVar1 = *(int *)((long)&(a_00->archive).error + 4);
    if (iVar1 == 0) {
      iVar1 = __archive_write_output(a_00,(void *)(ulong)in_stack_ffffffffffffffc8,0x2bac4e);
      if (iVar1 != 0) {
        return (long)iVar1;
      }
      a_00->nulls = (uchar *)(local_20 + (long)a_00->nulls);
      (a_00->archive).archive_format_name = local_20 + (long)(a_00->archive).archive_format_name;
    }
    else {
      if (iVar1 != 8) {
        archive_set_error(in_RDI,-1,"Invalid ZIP compression type");
        return -0x1e;
      }
      a_00->client_data = in_RSI;
      a_00->bytes_per_block = (int)local_20;
      uVar2 = 8;
      do {
        iVar1 = deflate(&a_00->client_data,0);
        if (iVar1 == -2) {
          return -0x1e;
        }
        if (*(int *)&a_00->format_data == 0) {
          iVar1 = __archive_write_output
                            (a_00,(void *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),0x2bad1a);
          if (iVar1 != 0) {
            return (long)iVar1;
          }
          (a_00->archive).archive_format_name =
               (a_00->archive).archive_format_name + (long)&(a_00[1].archive.vtable)->archive_close;
          a_00->nulls = a_00->nulls + (long)&(a_00[1].archive.vtable)->archive_close;
          a_00->filter_last = *(archive_write_filter **)&a_00[1].archive.archive_format;
          *(int *)&a_00->format_data = (int)a_00[1].archive.vtable;
        }
      } while (a_00->bytes_per_block != 0);
    }
    (a_00->archive).compression_name = (a_00->archive).compression_name + -(long)local_20;
    uVar2 = (**(code **)&(a_00->archive).current_codepage)
                      (*(undefined4 *)&(a_00->archive).error,in_RSI,(ulong)local_20 & 0xffffffff);
    *(undefined4 *)&(a_00->archive).error = uVar2;
    local_8 = local_20;
  }
  return (ssize_t)local_8;
}

Assistant:

static ssize_t
archive_write_zip_data(struct archive_write *a, const void *buff, size_t s)
{
	int ret;
	struct zip *zip = a->format_data;

	if ((int64_t)s > zip->entry_uncompressed_limit)
		s = (size_t)zip->entry_uncompressed_limit;
	zip->entry_uncompressed_written += s;

	if (s == 0) return 0;

	switch (zip->entry_compression) {
	case COMPRESSION_STORE:
		ret = __archive_write_output(a, buff, s);
		if (ret != ARCHIVE_OK)
			return (ret);
		zip->written_bytes += s;
		zip->entry_compressed_written += s;
		break;
#if HAVE_ZLIB_H
	case COMPRESSION_DEFLATE:
		zip->stream.next_in = (unsigned char*)(uintptr_t)buff;
		zip->stream.avail_in = (uInt)s;
		do {
			ret = deflate(&zip->stream, Z_NO_FLUSH);
			if (ret == Z_STREAM_ERROR)
				return (ARCHIVE_FATAL);
			if (zip->stream.avail_out == 0) {
				ret = __archive_write_output(a, zip->buf,
					zip->len_buf);
				if (ret != ARCHIVE_OK)
					return (ret);
				zip->entry_compressed_written += zip->len_buf;
				zip->written_bytes += zip->len_buf;
				zip->stream.next_out = zip->buf;
				zip->stream.avail_out = (uInt)zip->len_buf;
			}
		} while (zip->stream.avail_in != 0);
		break;
#endif

	default:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Invalid ZIP compression type");
		return ARCHIVE_FATAL;
	}

	zip->entry_uncompressed_limit -= s;
	zip->entry_crc32 = zip->crc32func(zip->entry_crc32, buff, (unsigned)s);
	return (s);

}